

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall QGles2CommandBuffer::~QGles2CommandBuffer(QGles2CommandBuffer *this)

{
  long lVar1;
  undefined1 *puVar2;
  Command *pCVar3;
  undefined8 *puVar4;
  QRhiBufferData *this_00;
  ulong uVar5;
  
  (this->super_QRhiCommandBuffer).super_QRhiResource._vptr_QRhiResource =
       (_func_int **)&PTR__QGles2CommandBuffer_007dec78;
  lVar1 = (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.s;
  puVar4 = (undefined8 *)(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.ptr;
  if (0 < lVar1) {
    uVar5 = lVar1 + 1;
    do {
      (**(code **)*puVar4)(puVar4);
      puVar4 = puVar4 + 3;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    puVar4 = (undefined8 *)(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.ptr;
  }
  if ((QVLAStorage<24UL,_8UL,_4LL> *)puVar4 !=
      &(this->imageRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>) {
    QtPrivate::sizedFree
              (puVar4,(this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.a * 0x18);
  }
  lVar1 = (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.s;
  this_00 = (QRhiBufferData *)
            (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.ptr;
  if (0 < lVar1) {
    uVar5 = lVar1 + 1;
    do {
      QRhiBufferData::~QRhiBufferData(this_00);
      this_00 = this_00 + 1;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    this_00 = (QRhiBufferData *)
              (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.ptr;
  }
  if ((QVLAStorage<8UL,_8UL,_4LL> *)this_00 !=
      &(this->bufferDataRetainPool).super_QVLAStorage<8UL,_8UL,_4LL>) {
    QtPrivate::sizedFree
              (this_00,(this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.
                       super_QVLABaseBase.a << 3);
  }
  std::_Destroy_n_aux<false>::__destroy_n<QByteArray*,long_long>
            ((QByteArray *)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr,
             (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s);
  puVar2 = (undefined1 *)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr;
  if ((QVLAStorage<24UL,_8UL,_4LL> *)puVar2 !=
      &(this->dataRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>) {
    QtPrivate::sizedFree
              (puVar2,(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.a * 0x18)
    ;
  }
  QHash<QRhiResource_*,_std::pair<int,_bool>_>::~QHash(&(this->computePassState).writtenResources);
  std::_Destroy_n_aux<false>::__destroy_n<QRhiPassResourceTracker*,long_long>
            ((QRhiPassResourceTracker *)
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.ptr,
             (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.s);
  puVar2 = (undefined1 *)
           (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.ptr;
  if ((QVLAStorage<16UL,_8UL,_8LL> *)puVar2 !=
      &(this->passResTrackers).super_QVLAStorage<16UL,_8UL,_8LL>) {
    QtPrivate::sizedFree
              (puVar2,(this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.
                      super_QVLABaseBase.a << 4);
  }
  pCVar3 = (this->commands).v;
  if (pCVar3 != (Command *)0x0) {
    operator_delete__(pCVar3);
  }
  QRhiResource::~QRhiResource((QRhiResource *)this);
  return;
}

Assistant:

QGles2CommandBuffer::~QGles2CommandBuffer()
{
    destroy();
}